

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool Internal_WriteEdgePtrList
               (unsigned_short edge_count,unsigned_short edgeN_capacity,ON_SubDEdgePtr *edgeN,
               unsigned_short edgeX_capacity,ON_SubDEdgePtr *edgeX,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_SubDComponentBase *this;
  uint local_4c;
  ON_SubDEdge *edge;
  ON_SubDEdgePtr *pOStack_38;
  unsigned_short i;
  ON_SubDEdgePtr *eptr;
  ON_BinaryArchive *archive_local;
  ON_SubDEdgePtr *edgeX_local;
  unsigned_short edgeX_capacity_local;
  ON_SubDEdgePtr *edgeN_local;
  unsigned_short edgeN_capacity_local;
  unsigned_short edge_count_local;
  
  edgeN_local._2_2_ = edgeN_capacity;
  edgeN_local._4_2_ = edge_count;
  ON_SubDArchiveIdMap::ValidateArrayCounts
            ((unsigned_short *)((long)&edgeN_local + 4),(ulong)edgeN_capacity,edgeN,edgeX_capacity,
             edgeX);
  bVar1 = ON_BinaryArchive::WriteShort(archive,edgeN_local._4_2_);
  if (bVar1) {
    if (edgeN_local._4_2_ == 0) {
      return true;
    }
    pOStack_38 = edgeN;
    for (edge._6_2_ = 0; edge._6_2_ < edgeN_local._4_2_; edge._6_2_ = edge._6_2_ + 1) {
      if (edge._6_2_ == edgeN_local._2_2_) {
        pOStack_38 = edgeX;
      }
      this = (ON_SubDComponentBase *)(pOStack_38->m_ptr & 0xfffffffffffffff8);
      if (this == (ON_SubDComponentBase *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = ON_SubDComponentBase::ArchiveId(this);
      }
      bVar1 = Internal_WriteArchiveIdAndFlags(local_4c,pOStack_38->m_ptr,archive);
      if (!bVar1) break;
      pOStack_38 = pOStack_38 + 1;
    }
    if (edgeN_local._4_2_ <= edge._6_2_) {
      return true;
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_WriteEdgePtrList(
  unsigned short edge_count,
  unsigned short edgeN_capacity,
  const ON_SubDEdgePtr* edgeN,
  unsigned short edgeX_capacity,
  const ON_SubDEdgePtr* edgeX,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    ON_SubDArchiveIdMap::ValidateArrayCounts(edge_count,edgeN_capacity,edgeN,edgeX_capacity,edgeX);

    if (!archive.WriteShort(edge_count))
      break;

    if ( 0 == edge_count )
      return true;

    const ON_SubDEdgePtr* eptr = edgeN;
    unsigned short i = 0;
    for (i = 0; i < edge_count; i++, eptr++)
    {
      if ( i == edgeN_capacity)
        eptr = edgeX;
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
      if (!Internal_WriteArchiveIdAndFlags((nullptr != edge) ? edge->ArchiveId() : 0,eptr->m_ptr,archive))
        break;
    }
    if ( i < edge_count )
      break;

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}